

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

TSRange * ts_tree_get_changed_ranges(TSTree *self,TSTree *other,uint32_t *count)

{
  TSNode node;
  TSNode node_00;
  uint uVar1;
  TSRange *result;
  TreeCursor cursor2;
  TreeCursor cursor1;
  TSRangeArray included_range_differences;
  TSNode root;
  TSRange *local_b0;
  TreeCursor local_a8;
  TreeCursor local_88;
  TSRangeArray local_68;
  TSNode local_50;
  
  local_88.tree = (TSTree *)0x0;
  local_88.stack.contents = (TreeCursorEntry *)0x0;
  local_88.stack.size = 0;
  local_88.stack.capacity = 0;
  local_a8.tree = (TSTree *)0x0;
  local_a8.stack.contents = (TreeCursorEntry *)0x0;
  local_a8.stack.size = 0;
  local_a8.stack.capacity = 0;
  ts_tree_root_node(&local_50,self);
  node.context[2] = local_50.context[2];
  node.context[3] = local_50.context[3];
  node.context[0] = local_50.context[0];
  node.context[1] = local_50.context[1];
  node.id = local_50.id;
  node.tree = local_50.tree;
  ts_tree_cursor_init(&local_88,node);
  node_00.context[2] = local_50.context[2];
  node_00.context[3] = local_50.context[3];
  node_00.context[0] = local_50.context[0];
  node_00.context[1] = local_50.context[1];
  node_00.id = local_50.id;
  node_00.tree = local_50.tree;
  ts_tree_cursor_init(&local_a8,node_00);
  local_68.contents = (TSRange *)0x0;
  local_68.size = 0;
  local_68.capacity = 0;
  ts_range_array_get_changed_ranges
            (self->included_ranges,self->included_range_count,other->included_ranges,
             other->included_range_count,&local_68);
  uVar1 = ts_subtree_get_changed_ranges
                    (&self->root,&other->root,&local_88,&local_a8,self->language,&local_68,&local_b0
                    );
  *count = uVar1;
  array__delete((VoidArray *)&local_68);
  array__delete((VoidArray *)&local_88.stack);
  array__delete((VoidArray *)&local_a8.stack);
  return local_b0;
}

Assistant:

TSRange *ts_tree_get_changed_ranges(const TSTree *self, const TSTree *other, uint32_t *count) {
  TSRange *result;
  TreeCursor cursor1 = {NULL, array_new()};
  TreeCursor cursor2 = {NULL, array_new()};
  TSNode root = ts_tree_root_node(self);
  ts_tree_cursor_init(&cursor1, root);
  ts_tree_cursor_init(&cursor2, root);

  TSRangeArray included_range_differences = array_new();
  ts_range_array_get_changed_ranges(
    self->included_ranges, self->included_range_count,
    other->included_ranges, other->included_range_count,
    &included_range_differences
  );

  *count = ts_subtree_get_changed_ranges(
    &self->root, &other->root, &cursor1, &cursor2,
    self->language, &included_range_differences, &result
  );

  array_delete(&included_range_differences);
  array_delete(&cursor1.stack);
  array_delete(&cursor2.stack);
  return result;
}